

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall TestPrettyPrintCoverage::TestPrettyPrintCoverage(TestPrettyPrintCoverage *this)

{
  allocator local_4a;
  allocator local_49;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string((string *)&local_28,"PrettyPrintCoverage",&local_49);
  std::__cxx11::string::string((string *)&local_48,"Test",&local_4a);
  testinator::Test::Test(&this->super_Test,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00177578;
  return;
}

Assistant:

DEF_TEST(PrettyPrintCoverage, Test)
{
  testinator::TestRegistry r;
  ostringstream oss;
  std::unique_ptr<testinator::Outputter> op =
    make_unique<testinator::DefaultOutputter>(oss);

  TestPrettyPrintCoverageInternal myTestA(r, "A");
  testinator::Results rs = r.RunAllTests(testinator::RunParams(), op.get());

  static string expected1 = "[1,2,3]";
  static string expected2 = "\"Hello\"";
  return oss.str().find(expected1) != string::npos
    && oss.str().find(expected2) != string::npos;
}